

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O3

void __thiscall
QStyledItemDelegate::initStyleOption
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  long lVar4;
  QAbstractItemModel *pQVar5;
  QMetaTypeInterface *pQVar6;
  InterfaceType *pIVar7;
  QIconPrivate *pQVar8;
  char16_t *pcVar9;
  undefined1 *puVar10;
  undefined8 uVar11;
  quintptr qVar12;
  undefined8 uVar13;
  QMetaType QVar14;
  QMetaType QVar15;
  QIcon QVar16;
  char cVar17;
  bool bVar18;
  QFlags<Qt::AlignmentFlag> QVar19;
  CheckState CVar20;
  int iVar21;
  ulong uVar22;
  QSize QVar23;
  QSize QVar24;
  QMetaType QVar25;
  ulong uVar26;
  State SVar27;
  ulong uVar28;
  long lVar29;
  QPixmap *this_00;
  QBrush *pQVar30;
  QFont *pQVar31;
  long in_FS_OFFSET;
  double dVar32;
  undefined1 auVar33 [16];
  QFont t;
  QIcon local_88;
  QIcon local_80;
  QIcon local_78;
  undefined4 uStack_70;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (option->index).m.ptr = (index->m).ptr;
  iVar21 = index->c;
  qVar12 = index->i;
  (option->index).r = index->r;
  (option->index).c = iVar21;
  (option->index).i = qVar12;
  lVar4 = *(long *)(this + 8);
  pQVar5 = (index->m).ptr;
  if (pQVar5 != (QAbstractItemModel *)0x0) {
    (**(code **)(*(long *)pQVar5 + 0x168))(pQVar5,index,lVar4 + 0x80,7);
  }
  lVar29 = 0x80;
  do {
    if (*(int *)(lVar4 + lVar29) == 6) goto LAB_0055dc5c;
    lVar29 = lVar29 + 0x28;
  } while (lVar29 != 0x198);
  lVar29 = 0x198;
LAB_0055dc5c:
  if (3 < *(ulong *)(lVar4 + 0x20 + lVar29)) {
    pQVar31 = (QFont *)(lVar4 + lVar29 + 8);
    cVar17 = ::QVariant::isNull();
    if (cVar17 == '\0') {
      lVar29 = lVar29 + lVar4;
      local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QFont>::metaType;
      uVar22 = *(ulong *)(lVar29 + 0x20) & 0xfffffffffffffffc;
      local_78.d._0_4_ = (undefined4)uVar22;
      local_78.d._4_2_ = (undefined2)(uVar22 >> 0x20);
      local_78.d._6_2_ = (undefined2)(uVar22 >> 0x30);
      bVar18 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
      if (bVar18) {
        if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
          pQVar31 = (QFont *)((long)*(int *)(*(long *)pQVar31 + 4) + *(long *)pQVar31);
        }
        QFont::QFont((QFont *)&local_78,pQVar31);
      }
      else {
        local_78.d._0_4_ = 0xaaaaaaaa;
        local_78.d._4_2_ = 0xaaaa;
        local_78.d._6_2_ = 0xaaaa;
        uStack_70 = 0xaaaaaaaa;
        uStack_6c = 0xaaaa;
        uStack_6a = 0xaaaa;
        QFont::QFont((QFont *)&local_78);
        QVar25.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
          pQVar31 = (QFont *)((long)*(int *)(*(long *)pQVar31 + 4) + *(long *)pQVar31);
        }
        QMetaType::convert(QVar25,pQVar31,(QMetaType)local_58._0_8_,&local_78);
      }
      QFont::resolve((QFont *)local_58);
      pQVar6 = *(QMetaTypeInterface **)&option->font;
      *(undefined8 *)&option->font = local_58._0_8_;
      uVar2 = *(undefined4 *)&option->field_0x60;
      *(undefined4 *)&option->field_0x60 = local_58._8_4_;
      local_58._8_4_ = uVar2;
      local_58._0_8_ = pQVar6;
      QFont::~QFont((QFont *)local_58);
      QFont::~QFont((QFont *)&local_78);
      QFontMetrics::QFontMetrics((QFontMetrics *)local_58,&option->font);
      pIVar7 = *(InterfaceType **)&(option->super_QStyleOption).fontMetrics;
      *(undefined8 *)&(option->super_QStyleOption).fontMetrics = local_58._0_8_;
      local_58._0_8_ = pIVar7;
      QFontMetrics::~QFontMetrics((QFontMetrics *)local_58);
    }
  }
  lVar29 = 0x80;
  do {
    if (*(int *)(lVar4 + lVar29) == 7) goto LAB_0055dda3;
    lVar29 = lVar29 + 0x28;
  } while (lVar29 != 0x198);
  lVar29 = 0x198;
LAB_0055dda3:
  if (3 < *(ulong *)(lVar4 + 0x20 + lVar29)) {
    cVar17 = ::QVariant::isNull();
    if (cVar17 == '\0') {
      QVar19 = QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>
                         ((QVariant *)(lVar4 + lVar29 + 8));
      (option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (Int)QVar19.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                super_QFlagsStorage<Qt::AlignmentFlag>.i;
    }
  }
  lVar29 = 0x80;
  do {
    if (*(int *)(lVar4 + lVar29) == 9) goto LAB_0055ddea;
    lVar29 = lVar29 + 0x28;
  } while (lVar29 != 0x198);
  lVar29 = 0x198;
LAB_0055ddea:
  cVar17 = QMetaType::canConvert
                     ((QMetaTypeInterface *)(*(ulong *)(lVar4 + 0x20 + lVar29) & 0xfffffffffffffffc)
                      ,(QMetaType)0x7ebf88);
  if (cVar17 != '\0') {
    lVar1 = lVar4 + lVar29;
    pQVar30 = (QBrush *)(lVar4 + lVar29 + 8);
    local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
    uVar22 = *(ulong *)(lVar1 + 0x20) & 0xfffffffffffffffc;
    local_78.d._0_4_ = (undefined4)uVar22;
    local_78.d._4_2_ = (undefined2)(uVar22 >> 0x20);
    local_78.d._6_2_ = (undefined2)(uVar22 >> 0x30);
    bVar18 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
    if (bVar18) {
      if ((*(byte *)(lVar1 + 0x20) & 1) != 0) {
        pQVar30 = (QBrush *)((long)*(int *)(*(long *)pQVar30 + 4) + *(long *)pQVar30);
      }
      QBrush::QBrush((QBrush *)&local_78,pQVar30);
    }
    else {
      local_78.d._0_4_ = 0xaaaaaaaa;
      local_78.d._4_2_ = 0xaaaa;
      local_78.d._6_2_ = 0xaaaa;
      QBrush::QBrush((QBrush *)&local_78);
      QVar25.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar1 + 0x20) & 1) != 0) {
        pQVar30 = (QBrush *)((long)*(int *)(*(long *)pQVar30 + 4) + *(long *)pQVar30);
      }
      QMetaType::convert(QVar25,pQVar30,(QMetaType)local_58._0_8_,&local_78);
    }
    QPalette::setBrush((int)option + 0x28,Mid,(QBrush *)0x6);
    QBrush::~QBrush((QBrush *)&local_78);
  }
  lVar29 = 0x80;
  do {
    if (*(int *)(lVar4 + lVar29) == 10) goto LAB_0055dedf;
    lVar29 = lVar29 + 0x28;
  } while (lVar29 != 0x198);
  lVar29 = 0x198;
LAB_0055dedf:
  if (3 < *(ulong *)(lVar4 + 0x20 + lVar29)) {
    cVar17 = ::QVariant::isNull();
    if (cVar17 == '\0') {
      *(byte *)&(option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
           (byte)(option->features).
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 4;
      CVar20 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>
                         ((QVariant *)(lVar4 + lVar29 + 8));
      option->checkState = CVar20;
    }
  }
  lVar29 = 0x80;
  do {
    if (*(int *)(lVar4 + lVar29) == 1) goto LAB_0055df2d;
    lVar29 = lVar29 + 0x28;
  } while (lVar29 != 0x198);
  lVar29 = 0x198;
LAB_0055df2d:
  if (*(ulong *)(lVar4 + 0x20 + lVar29) < 4) goto switchD_0055df7c_caseD_1002;
  this_00 = (QPixmap *)(lVar4 + lVar29 + 8);
  cVar17 = ::QVariant::isNull();
  if (cVar17 != '\0') goto switchD_0055df7c_caseD_1002;
  *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
            super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
       (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
             super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 0x10;
  iVar21 = ::QVariant::typeId((QVariant *)this_00);
  if (5 < iVar21 - 0x1001U) goto switchD_0055df7c_caseD_1002;
  lVar29 = lVar29 + lVar4;
  switch(iVar21) {
  case 0x1001:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d._0_4_ = 0x7e8040;
    local_78.d._4_2_ = 0;
    local_78.d._6_2_ = 0;
    local_80.d = (QIconPrivate *)(*(ulong *)(lVar29 + 0x20) & 0xfffffffffffffffc);
    bVar18 = comparesEqual((QMetaType *)&local_80,(QMetaType *)&local_78);
    if (bVar18) {
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QPixmap::QPixmap((QPixmap *)local_58,this_00);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)local_58);
      QVar25.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QVar14.d_ptr._4_2_ = local_78.d._4_2_;
      QVar14.d_ptr._0_4_ = local_78.d._0_4_;
      QVar14.d_ptr._6_2_ = local_78.d._6_2_;
      QMetaType::convert(QVar25,this_00,QVar14,local_58);
    }
    QIcon::QIcon(&local_80,(QPixmap *)local_58);
    QVar16.d = local_80.d;
    local_80.d = (QIconPrivate *)0x0;
    pQVar8 = (option->icon).d;
    (option->icon).d = QVar16.d;
    local_78.d._0_4_ = SUB84(pQVar8,0);
    local_78.d._4_2_ = (undefined2)((ulong)pQVar8 >> 0x20);
    local_78.d._6_2_ = (undefined2)((ulong)pQVar8 >> 0x30);
    QIcon::~QIcon(&local_78);
    QIcon::~QIcon(&local_80);
    auVar33 = QPixmap::deviceIndependentSize();
    dVar32 = (double)((ulong)auVar33._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar33._0_8_;
    bVar18 = 2147483647.0 < dVar32;
    if (dVar32 <= -2147483648.0) {
      dVar32 = -2147483648.0;
    }
    QVar23.wd.m_i =
         (int)(double)(-(ulong)bVar18 & 0x41dfffffffc00000 | ~-(ulong)bVar18 & (ulong)dVar32);
    dVar32 = (double)((ulong)auVar33._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar33._8_8_;
    bVar18 = 2147483647.0 < dVar32;
    if (dVar32 <= -2147483648.0) {
      dVar32 = -2147483648.0;
    }
    QVar23.ht.m_i =
         (int)(double)(-(ulong)bVar18 & 0x41dfffffffc00000 | ~-(ulong)bVar18 & (ulong)dVar32);
    option->decorationSize = QVar23;
    goto LAB_0055e3f1;
  case 0x1003:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)local_58,&option->decorationSize);
    local_80.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QColor>::metaType;
    uVar22 = *(ulong *)(lVar29 + 0x20) & 0xfffffffffffffffc;
    local_78.d._0_4_ = (undefined4)uVar22;
    local_78.d._4_2_ = (undefined2)(uVar22 >> 0x20);
    local_78.d._6_2_ = (undefined2)(uVar22 >> 0x30);
    bVar18 = comparesEqual((QMetaType *)&local_78,(QMetaType *)&local_80);
    if (bVar18) {
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      uVar11 = *(undefined8 *)this_00;
      uVar13 = *(undefined8 *)(this_00 + 8);
      local_78.d._0_4_ = (undefined4)uVar11;
      local_78.d._4_2_ = (undefined2)((ulong)uVar11 >> 0x20);
      local_78.d._6_2_ = (undefined2)((ulong)uVar11 >> 0x30);
      uStack_70 = (undefined4)uVar13;
      uStack_6c = (undefined2)((ulong)uVar13 >> 0x20);
      uStack_6a = (undefined2)((ulong)uVar13 >> 0x30);
    }
    else {
      uStack_6a = 0xaaaa;
      local_78.d._0_4_ = 0;
      local_78.d._4_2_ = 0xffff;
      local_78.d._6_2_ = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      QVar25.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QMetaType::convert(QVar25,this_00,(QMetaType)local_80.d,&local_78);
    }
    QPixmap::fill((QColor *)local_58);
    QIcon::QIcon(&local_80,(QPixmap *)local_58);
    QVar16.d = local_80.d;
    local_80.d = (QIconPrivate *)0x0;
    pQVar8 = (option->icon).d;
    (option->icon).d = QVar16.d;
    local_78.d._0_4_ = SUB84(pQVar8,0);
    local_78.d._4_2_ = (undefined2)((ulong)pQVar8 >> 0x20);
    local_78.d._6_2_ = (undefined2)((ulong)pQVar8 >> 0x30);
    QIcon::~QIcon(&local_78);
    QIcon::~QIcon(&local_80);
LAB_0055e3f1:
    QPixmap::~QPixmap((QPixmap *)local_58);
    break;
  case 0x1005:
    local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    uVar22 = *(ulong *)(lVar29 + 0x20) & 0xfffffffffffffffc;
    local_78.d._0_4_ = (undefined4)uVar22;
    local_78.d._4_2_ = (undefined2)(uVar22 >> 0x20);
    local_78.d._6_2_ = (undefined2)(uVar22 >> 0x30);
    bVar18 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
    if (bVar18) {
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QIcon::QIcon(&local_78,(QIcon *)this_00);
    }
    else {
      local_78.d._0_4_ = 0xaaaaaaaa;
      local_78.d._4_2_ = 0xaaaa;
      local_78.d._6_2_ = 0xaaaa;
      QIcon::QIcon(&local_78);
      QVar25.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QMetaType::convert(QVar25,this_00,(QMetaType)local_58._0_8_,&local_78);
    }
    pQVar8 = (QIconPrivate *)CONCAT26(local_78.d._6_2_,CONCAT24(local_78.d._4_2_,local_78.d._0_4_));
    local_78.d._0_4_ = 0;
    local_78.d._4_2_ = 0;
    local_78.d._6_2_ = 0;
    local_58._0_8_ = (option->icon).d;
    (option->icon).d = pQVar8;
    QIcon::~QIcon((QIcon *)local_58);
    QIcon::~QIcon(&local_78);
    cVar17 = QIcon::isNull();
    if (cVar17 == '\0') {
      uVar3 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
      SVar27 = Off;
      if ((uVar3 & 1) != 0) {
        SVar27 = (uint)(int)(short)uVar3 >> 0xf & 3;
      }
      uVar22 = QIcon::actualSize((QSize *)&option->icon,(int)option + 0x50,SVar27);
      uVar26 = uVar22 >> 0x20;
      uVar3 = (option->decorationSize).wd.m_i;
      uVar28 = (ulong)uVar3;
      if ((int)uVar22 <= (int)uVar3) {
        uVar28 = uVar22 & 0xffffffff;
      }
      uVar3 = (option->decorationSize).ht.m_i;
      if ((int)uVar3 < (int)(uVar22 >> 0x20)) {
        uVar26 = (ulong)uVar3;
      }
      option->decorationSize = (QSize)(uVar28 | uVar26 << 0x20);
    }
    else {
      *(byte *)&(option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
           (byte)(option->features).
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xef;
    }
    break;
  case 0x1006:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d._0_4_ = 0x80c110;
    local_78.d._4_2_ = 0;
    local_78.d._6_2_ = 0;
    local_80.d = (QIconPrivate *)(*(ulong *)(lVar29 + 0x20) & 0xfffffffffffffffc);
    bVar18 = comparesEqual((QMetaType *)&local_80,(QMetaType *)&local_78);
    if (bVar18) {
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QImage::QImage((QImage *)local_58,(QImage *)this_00);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_58);
      QVar25.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar29 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QVar15.d_ptr._4_2_ = local_78.d._4_2_;
      QVar15.d_ptr._0_4_ = local_78.d._0_4_;
      QVar15.d_ptr._6_2_ = local_78.d._6_2_;
      QMetaType::convert(QVar25,this_00,QVar15,local_58);
    }
    QPixmap::fromImage((QPixmap *)&local_78,(QImage *)local_58,0);
    QIcon::QIcon(&local_88,(QPixmap *)&local_78);
    QVar16.d = local_88.d;
    local_88.d = (QIconPrivate *)0x0;
    local_80.d = (option->icon).d;
    (option->icon).d = QVar16.d;
    QIcon::~QIcon(&local_80);
    QIcon::~QIcon(&local_88);
    QPixmap::~QPixmap((QPixmap *)&local_78);
    auVar33 = QImage::deviceIndependentSize();
    dVar32 = (double)((ulong)auVar33._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar33._0_8_;
    bVar18 = 2147483647.0 < dVar32;
    if (dVar32 <= -2147483648.0) {
      dVar32 = -2147483648.0;
    }
    QVar24.wd.m_i =
         (int)(double)(-(ulong)bVar18 & 0x41dfffffffc00000 | ~-(ulong)bVar18 & (ulong)dVar32);
    dVar32 = (double)((ulong)auVar33._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar33._8_8_;
    bVar18 = 2147483647.0 < dVar32;
    if (dVar32 <= -2147483648.0) {
      dVar32 = -2147483648.0;
    }
    QVar24.ht.m_i =
         (int)(double)(-(ulong)bVar18 & 0x41dfffffffc00000 | ~-(ulong)bVar18 & (ulong)dVar32);
    option->decorationSize = QVar24;
    QImage::~QImage((QImage *)local_58);
  }
switchD_0055df7c_caseD_1002:
  lVar29 = 0x80;
  do {
    if (*(int *)(lVar4 + lVar29) == 0) goto LAB_0055e558;
    lVar29 = lVar29 + 0x28;
  } while (lVar29 != 0x198);
  lVar29 = 0x198;
LAB_0055e558:
  if (3 < *(ulong *)(lVar4 + 0x20 + lVar29)) {
    cVar17 = ::QVariant::isNull();
    if (cVar17 == '\0') {
      *(byte *)&(option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
           (byte)(option->features).
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 8;
      (**(code **)(*(long *)this + 0xb0))(local_58,this,lVar4 + lVar29 + 8,&option->locale);
      pQVar6 = (QMetaTypeInterface *)(option->text).d.d;
      pcVar9 = (option->text).d.ptr;
      (option->text).d.d = (Data *)local_58._0_8_;
      (option->text).d.ptr = (char16_t *)local_58._8_8_;
      puVar10 = (undefined1 *)(option->text).d.size;
      (option->text).d.size = (qsizetype)local_48;
      local_58._8_8_ = pcVar9;
      local_48 = puVar10;
      if (pQVar6 != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)pQVar6 = *(int *)pQVar6 + -1;
        iVar21._0_2_ = pQVar6->revision;
        iVar21._2_2_ = pQVar6->alignment;
        UNLOCK();
        if (iVar21 == 0) {
          local_58._0_8_ = pQVar6;
          QArrayData::deallocate((QArrayData *)pQVar6,2,0x10);
        }
      }
    }
  }
  lVar29 = 0x80;
  do {
    if (*(int *)(lVar4 + lVar29) == 8) goto LAB_0055e60e;
    lVar29 = lVar29 + 0x28;
  } while (lVar29 != 0x198);
  lVar29 = 0x198;
LAB_0055e60e:
  pQVar30 = (QBrush *)(lVar4 + lVar29 + 8);
  local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
  uVar22 = *(ulong *)(lVar4 + lVar29 + 0x20) & 0xfffffffffffffffc;
  local_78.d._0_4_ = (undefined4)uVar22;
  local_78.d._4_2_ = (undefined2)(uVar22 >> 0x20);
  local_78.d._6_2_ = (undefined2)(uVar22 >> 0x30);
  bVar18 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
  if (bVar18) {
    if ((*(byte *)(lVar4 + lVar29 + 0x20) & 1) != 0) {
      pQVar30 = (QBrush *)((long)*(int *)(*(long *)pQVar30 + 4) + *(long *)pQVar30);
    }
    QBrush::QBrush((QBrush *)&local_78,pQVar30);
  }
  else {
    local_78.d._0_4_ = 0xaaaaaaaa;
    local_78.d._4_2_ = 0xaaaa;
    local_78.d._6_2_ = 0xaaaa;
    QBrush::QBrush((QBrush *)&local_78);
    QVar25.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((*(byte *)(lVar4 + lVar29 + 0x20) & 1) != 0) {
      pQVar30 = (QBrush *)((long)*(int *)(*(long *)pQVar30 + 4) + *(long *)pQVar30);
    }
    QMetaType::convert(QVar25,pQVar30,(QMetaType)local_58._0_8_,&local_78);
  }
  uVar11 = *(undefined8 *)&option->backgroundBrush;
  *(ulong *)&option->backgroundBrush =
       CONCAT26(local_78.d._6_2_,CONCAT24(local_78.d._4_2_,local_78.d._0_4_));
  local_78.d._0_4_ = (undefined4)uVar11;
  local_78.d._4_2_ = (undefined2)((ulong)uVar11 >> 0x20);
  local_78.d._6_2_ = (undefined2)((ulong)uVar11 >> 0x30);
  QBrush::~QBrush((QBrush *)&local_78);
  (option->super_QStyleOption).styleObject = (QObject *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::initStyleOption(QStyleOptionViewItem *option,
                                         const QModelIndex &index) const
{
    option->index = index;

    Q_D(const QStyledItemDelegate);
    QModelRoleDataSpan modelRoleDataSpan = d->modelRoleData;
    index.multiData(modelRoleDataSpan);

    const QVariant *value;
    value = modelRoleDataSpan.dataForRole(Qt::FontRole);
    if (value->isValid() && !value->isNull()) {
        option->font = qvariant_cast<QFont>(*value).resolve(option->font);
        option->fontMetrics = QFontMetrics(option->font);
    }

    value = modelRoleDataSpan.dataForRole(Qt::TextAlignmentRole);
    if (value->isValid() && !value->isNull())
        option->displayAlignment = QtPrivate::legacyFlagValueFromModelData<Qt::Alignment>(*value);

    value = modelRoleDataSpan.dataForRole(Qt::ForegroundRole);
    if (value->canConvert<QBrush>())
        option->palette.setBrush(QPalette::Text, qvariant_cast<QBrush>(*value));

    value = modelRoleDataSpan.dataForRole(Qt::CheckStateRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasCheckIndicator;
        option->checkState = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(*value);
    }

    value = modelRoleDataSpan.dataForRole(Qt::DecorationRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDecoration;
        switch (value->userType()) {
        case QMetaType::QIcon: {
            option->icon = qvariant_cast<QIcon>(*value);
            if (option->icon.isNull()) {
                option->features &= ~QStyleOptionViewItem::HasDecoration;
                break;
            }
            QIcon::Mode mode;
            if (!(option->state & QStyle::State_Enabled))
                mode = QIcon::Disabled;
            else if (option->state & QStyle::State_Selected)
                mode = QIcon::Selected;
            else
                mode = QIcon::Normal;
            QIcon::State state = option->state & QStyle::State_Open ? QIcon::On : QIcon::Off;
            QSize actualSize = option->icon.actualSize(option->decorationSize, mode, state);
            // For highdpi icons actualSize might be larger than decorationSize, which we don't want. Clamp it to decorationSize.
            option->decorationSize = QSize(qMin(option->decorationSize.width(), actualSize.width()),
                                           qMin(option->decorationSize.height(), actualSize.height()));
            break;
        }
        case QMetaType::QColor: {
            QPixmap pixmap(option->decorationSize);
            pixmap.fill(qvariant_cast<QColor>(*value));
            option->icon = QIcon(pixmap);
            break;
        }
        case QMetaType::QImage: {
            QImage image = qvariant_cast<QImage>(*value);
            option->icon = QIcon(QPixmap::fromImage(image));
            option->decorationSize = image.deviceIndependentSize().toSize();
            break;
        }
        case QMetaType::QPixmap: {
            QPixmap pixmap = qvariant_cast<QPixmap>(*value);
            option->icon = QIcon(pixmap);
            option->decorationSize = pixmap.deviceIndependentSize().toSize();
            break;
        }
        default:
            break;
        }
    }

    value = modelRoleDataSpan.dataForRole(Qt::DisplayRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDisplay;
        option->text = displayText(*value, option->locale);
    }

    value = modelRoleDataSpan.dataForRole(Qt::BackgroundRole);
    option->backgroundBrush = qvariant_cast<QBrush>(*value);

    // disable style animations for checkboxes etc. within itemviews (QTBUG-30146)
    option->styleObject = nullptr;
}